

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

CURLcode dohprobe(Curl_easy *data,dnsprobe *p,DNStype dnstype,char *host,char *url,CURLM *multi,
                 curl_slist *headers)

{
  Curl_easy *data_00;
  dnsprobe *pdVar1;
  uchar *puVar2;
  CURLcode CVar3;
  CURLMcode CVar4;
  size_t sVar5;
  char *pcVar6;
  timediff_t tVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  uchar *puVar11;
  uchar *puVar12;
  Curl_easy *doh;
  Curl_easy *local_68;
  char *local_60;
  dnsprobe *local_58;
  char *b64;
  CURLM *local_48;
  uchar *local_40;
  size_t b64len;
  
  doh = (Curl_easy *)0x0;
  sVar5 = strlen(host);
  if (sVar5 - 0x1f1 < 0xfffffffffffffdff) {
    uVar10 = 4;
LAB_00414d2d:
    Curl_failf(data,"Failed to encode DOH packet [%d]\n",uVar10);
    return CURLE_OUT_OF_MEMORY;
  }
  local_40 = p->dohbuffer;
  p->dohbuffer[0] = '\0';
  p->dohbuffer[1] = '\0';
  p->dohbuffer[2] = '\x01';
  p->dohbuffer[3] = '\0';
  p->dohbuffer[4] = '\0';
  p->dohbuffer[5] = '\x01';
  p->dohbuffer[6] = '\0';
  p->dohbuffer[7] = '\0';
  p->dohbuffer[8] = '\0';
  p->dohbuffer[9] = '\0';
  p->dohbuffer[10] = '\0';
  p->dohbuffer[0xb] = '\0';
  puVar12 = p->dohbuffer + 0xc;
  local_68 = data;
  local_60 = url;
  local_58 = p;
  local_48 = multi;
  do {
    puVar11 = puVar12;
    pcVar6 = strchr(host,0x2e);
    if (pcVar6 == (char *)0x0) {
      sVar5 = strlen(host);
    }
    else {
      sVar5 = (long)pcVar6 - (long)host;
    }
    if (0x3f < sVar5) {
      uVar10 = 1;
      local_58->dohlen = 0;
      data = local_68;
      goto LAB_00414d2d;
    }
    *puVar11 = (uchar)sVar5;
    memcpy(puVar11 + 1,host,sVar5);
    puVar2 = local_40;
    pdVar1 = local_58;
    data_00 = local_68;
    puVar12 = puVar11 + sVar5 + 1;
    host = host + sVar5 + 1;
  } while (pcVar6 != (char *)0x0);
  puVar12[0] = '\0';
  puVar12[1] = '\0';
  puVar11[sVar5 + 3] = (uchar)dnstype;
  (puVar11 + sVar5 + 4)[0] = '\0';
  (puVar11 + sVar5 + 4)[1] = '\x01';
  local_58->dohlen = (size_t)(puVar12 + (5 - (long)local_40));
  local_58->dnstype = dnstype;
  (local_58->serverdoh).memory = (uchar *)0x0;
  (local_58->serverdoh).size = 0;
  if (((local_68->set).field_0x87f & 1) == 0) {
    pcVar8 = (char *)0x0;
    pcVar6 = local_60;
LAB_00414c9f:
    local_60 = pcVar6;
    tVar7 = Curl_timeleft(data_00,(curltime *)0x0,true);
    CVar3 = Curl_open(&doh);
    if ((((((CVar3 == CURLE_OK) &&
           (CVar3 = curl_easy_setopt(doh,CURLOPT_URL,local_60), CVar3 == CURLE_OK)) &&
          (CVar3 = curl_easy_setopt(doh,CURLOPT_WRITEFUNCTION,doh_write_cb), CVar3 == CURLE_OK)) &&
         (CVar3 = curl_easy_setopt(doh,CURLOPT_WRITEDATA,&pdVar1->serverdoh), CVar3 == CURLE_OK)) &&
        (((*(ulong *)&(data_00->set).field_0x878 & 0x100000000000000) != 0 ||
         ((CVar3 = curl_easy_setopt(doh,CURLOPT_POSTFIELDS,puVar2), CVar3 == CURLE_OK &&
          (CVar3 = curl_easy_setopt(doh,CURLOPT_POSTFIELDSIZE,pdVar1->dohlen), CVar3 == CURLE_OK))))
        )) && ((CVar3 = curl_easy_setopt(doh,CURLOPT_HTTPHEADER,headers), CVar3 == CURLE_OK &&
               ((CVar3 = curl_easy_setopt(doh,CURLOPT_PROTOCOLS,2), CVar3 == CURLE_OK &&
                (CVar3 = curl_easy_setopt(doh,CURLOPT_TIMEOUT_MS,tVar7), CVar3 == CURLE_OK)))))) {
      uVar9 = *(ulong *)&(data_00->set).field_0x878;
      if (((uint)uVar9 >> 0x1e & 1) != 0) {
        CVar3 = curl_easy_setopt(doh,CURLOPT_VERBOSE,1);
        if (CVar3 != CURLE_OK) goto LAB_00414d63;
        uVar9 = *(ulong *)&(local_68->set).field_0x878;
      }
      if ((((((((((uVar9 >> 0x22 & 1) == 0) ||
                (CVar3 = curl_easy_setopt(doh,CURLOPT_NOSIGNAL,1), CVar3 == CURLE_OK)) &&
               ((((local_68->set).ssl.field_0xa0 & 2) == 0 ||
                (CVar3 = curl_easy_setopt(doh,CURLOPT_SSL_FALSESTART,1), CVar3 == CURLE_OK)))) &&
              (((((local_68->set).ssl.primary.field_0x48 & 2) == 0 ||
                (CVar3 = curl_easy_setopt(doh,CURLOPT_SSL_VERIFYHOST,2), CVar3 == CURLE_OK)) &&
               ((((local_68->set).proxy_ssl.primary.field_0x48 & 2) == 0 ||
                (CVar3 = curl_easy_setopt(doh,CURLOPT_PROXY_SSL_VERIFYHOST,2), CVar3 == CURLE_OK))))
              )) && ((((((local_68->set).ssl.primary.field_0x48 & 1) == 0 ||
                       (CVar3 = curl_easy_setopt(doh,CURLOPT_SSL_VERIFYPEER,1), CVar3 == CURLE_OK))
                      && ((((local_68->set).proxy_ssl.primary.field_0x48 & 1) == 0 ||
                          (CVar3 = curl_easy_setopt(doh,CURLOPT_PROXY_SSL_VERIFYPEER,1),
                          CVar3 == CURLE_OK)))) &&
                     ((((local_68->set).ssl.primary.field_0x48 & 4) == 0 ||
                      (CVar3 = curl_easy_setopt(doh,CURLOPT_SSL_VERIFYSTATUS,1), CVar3 == CURLE_OK))
                     )))) &&
            (((local_68->set).str[0x1c] == (char *)0x0 ||
             (CVar3 = curl_easy_setopt(doh,CURLOPT_CAINFO), CVar3 == CURLE_OK)))) &&
           (((((local_68->set).str[0x1d] == (char *)0x0 ||
              (CVar3 = curl_easy_setopt(doh,CURLOPT_PROXY_CAINFO), CVar3 == CURLE_OK)) &&
             (((local_68->set).str[0x1a] == (char *)0x0 ||
              (CVar3 = curl_easy_setopt(doh,CURLOPT_CAPATH), CVar3 == CURLE_OK)))) &&
            ((((local_68->set).str[0x1b] == (char *)0x0 ||
              (CVar3 = curl_easy_setopt(doh,CURLOPT_PROXY_CAPATH), CVar3 == CURLE_OK)) &&
             ((((local_68->set).str[0x27] == (char *)0x0 ||
               (CVar3 = curl_easy_setopt(doh,CURLOPT_CRLFILE), CVar3 == CURLE_OK)) &&
              (((((local_68->set).str[0x28] == (char *)0x0 ||
                 (CVar3 = curl_easy_setopt(doh,CURLOPT_PROXY_CRLFILE), CVar3 == CURLE_OK)) &&
                ((((local_68->set).ssl.field_0xa0 & 1) == 0 ||
                 (CVar3 = curl_easy_setopt(doh,CURLOPT_CERTINFO,1), CVar3 == CURLE_OK)))) &&
               (((local_68->set).str[0x25] == (char *)0x0 ||
                (CVar3 = curl_easy_setopt(doh,CURLOPT_RANDOM_FILE), CVar3 == CURLE_OK)))))))))))) &&
          (((local_68->set).str[0x24] == (char *)0x0 ||
           (CVar3 = curl_easy_setopt(doh,CURLOPT_EGDSOCKET), CVar3 == CURLE_OK)))) &&
         (((((((local_68->set).ssl.field_0xa0 & 8) == 0 ||
             (CVar3 = curl_easy_setopt(doh,CURLOPT_SSL_OPTIONS,2), CVar3 == CURLE_OK)) &&
            ((((local_68->set).proxy_ssl.field_0xa0 & 8) == 0 ||
             (CVar3 = curl_easy_setopt(doh,CURLOPT_PROXY_SSL_OPTIONS,2), CVar3 == CURLE_OK)))) &&
           (((local_68->set).ssl.fsslctx == (curl_ssl_ctx_callback)0x0 ||
            (CVar3 = curl_easy_setopt(doh,CURLOPT_SSL_CTX_FUNCTION), CVar3 == CURLE_OK)))) &&
          (((local_68->set).ssl.fsslctxp == (void *)0x0 ||
           (CVar3 = curl_easy_setopt(doh,CURLOPT_SSL_CTX_DATA), CVar3 == CURLE_OK)))))) {
        (doh->set).fmultidone = Curl_doh_done;
        (doh->set).dohfor = local_68;
        local_58->easy = doh;
        CVar4 = curl_multi_add_handle(local_48,doh);
        CVar3 = CURLE_OK;
        if (CVar4 == CURLM_OK) {
          (*Curl_cfree)(pcVar8);
          return CURLE_OK;
        }
      }
    }
  }
  else {
    CVar3 = Curl_base64url_encode
                      (local_68,(char *)local_40,(size_t)(puVar12 + (5 - (long)local_40)),&b64,
                       &b64len);
    if (CVar3 == CURLE_OK) {
      pcVar8 = curl_maprintf("%s?dns=%s",local_60,b64);
      (*Curl_cfree)(b64);
      CVar3 = CURLE_OUT_OF_MEMORY;
      pcVar6 = pcVar8;
      if (pcVar8 != (char *)0x0) goto LAB_00414c9f;
    }
    pcVar8 = (char *)0x0;
  }
LAB_00414d63:
  (*Curl_cfree)(pcVar8);
  Curl_close(doh);
  return CVar3;
}

Assistant:

static CURLcode dohprobe(struct Curl_easy *data,
                         struct dnsprobe *p, DNStype dnstype,
                         const char *host,
                         const char *url, CURLM *multi,
                         struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  char *nurl = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_encode(host, dnstype, p->dohbuffer, sizeof(p->dohbuffer),
                         &p->dohlen);
  if(d) {
    failf(data, "Failed to encode DOH packet [%d]\n", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  p->serverdoh.memory = NULL;
  /* the memory will be grown as needed by realloc in the doh_write_cb
     function */
  p->serverdoh.size = 0;

  /* Note: this is code for sending the DoH request with GET but there's still
     no logic that actually enables this. We should either add that ability or
     yank out the GET code. Discuss! */
  if(data->set.doh_get) {
    char *b64;
    size_t b64len;
    result = Curl_base64url_encode(data, (char *)p->dohbuffer, p->dohlen,
                                   &b64, &b64len);
    if(result)
      goto error;
    nurl = aprintf("%s?dns=%s", url, b64);
    free(b64);
    if(!nurl) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }
    url = nurl;
  }

  timeout_ms = Curl_timeleft(data, NULL, TRUE);

  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(!result) {
    /* pass in the struct pointer via a local variable to please coverity and
       the gcc typecheck helpers */
    struct dohresponse *resp = &p->serverdoh;
    ERROR_CHECK_SETOPT(CURLOPT_URL, url);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, resp);
    if(!data->set.doh_get) {
      ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->dohbuffer);
      ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->dohlen);
    }
    ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_NGHTTP2
    ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
#endif
#ifndef CURLDEBUG
    /* enforce HTTPS if not debug */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#endif
    ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
    if(data->set.verbose)
      ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
    if(data->set.no_signal)
      ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

    /* Inherit *some* SSL options from the user's transfer. This is a
       best-guess as to which options are needed for compatibility. #3661 */
    if(data->set.ssl.falsestart)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
    if(data->set.ssl.primary.verifyhost)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST, 2L);
    if(data->set.proxy_ssl.primary.verifyhost)
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_SSL_VERIFYHOST, 2L);
    if(data->set.ssl.primary.verifypeer)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER, 1L);
    if(data->set.proxy_ssl.primary.verifypeer)
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_SSL_VERIFYPEER, 1L);
    if(data->set.ssl.primary.verifystatus)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS, 1L);
    if(data->set.str[STRING_SSL_CAFILE_ORIG]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
        data->set.str[STRING_SSL_CAFILE_ORIG]);
    }
    if(data->set.str[STRING_SSL_CAFILE_PROXY]) {
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_CAINFO,
        data->set.str[STRING_SSL_CAFILE_PROXY]);
    }
    if(data->set.str[STRING_SSL_CAPATH_ORIG]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
        data->set.str[STRING_SSL_CAPATH_ORIG]);
    }
    if(data->set.str[STRING_SSL_CAPATH_PROXY]) {
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_CAPATH,
        data->set.str[STRING_SSL_CAPATH_PROXY]);
    }
    if(data->set.str[STRING_SSL_CRLFILE_ORIG]) {
      ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
        data->set.str[STRING_SSL_CRLFILE_ORIG]);
    }
    if(data->set.str[STRING_SSL_CRLFILE_PROXY]) {
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_CRLFILE,
        data->set.str[STRING_SSL_CRLFILE_PROXY]);
    }
    if(data->set.ssl.certinfo)
      ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
    if(data->set.str[STRING_SSL_RANDOM_FILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_RANDOM_FILE,
        data->set.str[STRING_SSL_RANDOM_FILE]);
    }
    if(data->set.str[STRING_SSL_EGDSOCKET]) {
      ERROR_CHECK_SETOPT(CURLOPT_EGDSOCKET,
        data->set.str[STRING_SSL_EGDSOCKET]);
    }
    if(data->set.ssl.no_revoke)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);
    if(data->set.proxy_ssl.no_revoke)
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);
    if(data->set.ssl.fsslctx)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
    if(data->set.ssl.fsslctxp)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);

    doh->set.fmultidone = Curl_doh_done;
    doh->set.dohfor = data; /* identify for which transfer this is done */
    p->easy = doh;

    /* add this transfer to the multi handle */
    if(curl_multi_add_handle(multi, doh))
      goto error;
  }
  else
    goto error;
  free(nurl);
  return CURLE_OK;

  error:
  free(nurl);
  Curl_close(doh);
  return result;
}